

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# node-translator.c++
# Opt level: O0

String * __thiscall
capnp::compiler::NodeTranslator::BrandedDecl::toDebugString
          (String *__return_storage_ptr__,BrandedDecl *this)

{
  bool bVar1;
  ResolvedParameter *pRVar2;
  ResolvedDecl *pRVar3;
  char (*in_stack_ffffffffffffff38) [3];
  uint local_8c;
  undefined1 local_88 [8];
  ResolvedDecl decl;
  ResolvedParameter variable;
  BrandedDecl *this_local;
  
  variable._8_8_ = this;
  bVar1 = kj::
          OneOf<capnp::compiler::NodeTranslator::Resolver::ResolvedDecl,_capnp::compiler::NodeTranslator::Resolver::ResolvedParameter>
          ::is<capnp::compiler::NodeTranslator::Resolver::ResolvedParameter>(&this->body);
  if (bVar1) {
    pRVar2 = kj::
             OneOf<capnp::compiler::NodeTranslator::Resolver::ResolvedDecl,_capnp::compiler::NodeTranslator::Resolver::ResolvedParameter>
             ::get<capnp::compiler::NodeTranslator::Resolver::ResolvedParameter>(&this->body);
    decl.brand.ptr.field_1._40_8_ = pRVar2->id;
    variable.id = *(uint64_t *)&pRVar2->index;
    kj::str<char_const(&)[10],unsigned_long&,char_const(&)[3],unsigned_int&,char_const(&)[2]>
              (__return_storage_ptr__,(kj *)"variable(",
               (char (*) [10])((long)&decl.brand.ptr.field_1 + 0x28),(unsigned_long *)", ",
               (char (*) [3])&variable,(uint *)0xa46450,(char (*) [2])in_stack_ffffffffffffff38);
  }
  else {
    pRVar3 = kj::
             OneOf<capnp::compiler::NodeTranslator::Resolver::ResolvedDecl,_capnp::compiler::NodeTranslator::Resolver::ResolvedParameter>
             ::get<capnp::compiler::NodeTranslator::Resolver::ResolvedDecl>(&this->body);
    Resolver::ResolvedDecl::ResolvedDecl((ResolvedDecl *)local_88,pRVar3);
    local_8c = (uint)(ushort)decl.scopeId;
    kj::str<char_const(&)[6],unsigned_long&,char_const(&)[3],unsigned_int,char_const(&)[3]>
              (__return_storage_ptr__,(kj *)"decl(",(char (*) [6])local_88,(unsigned_long *)", ",
               (char (*) [3])&local_8c,(uint *)"\')",in_stack_ffffffffffffff38);
    Resolver::ResolvedDecl::~ResolvedDecl((ResolvedDecl *)local_88);
  }
  return __return_storage_ptr__;
}

Assistant:

kj::String NodeTranslator::BrandedDecl::toDebugString() {
  if (body.is<Resolver::ResolvedParameter>()) {
    auto variable = body.get<Resolver::ResolvedParameter>();
    return kj::str("variable(", variable.id, ", ", variable.index, ")");
  } else {
    auto decl = body.get<Resolver::ResolvedDecl>();
    return kj::str("decl(", decl.id, ", ", (uint)decl.kind, "')");
  }
}